

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FourByteChunk.h
# Opt level: O0

FourByteChunk * __thiscall DIS::FourByteChunk::operator=(FourByteChunk *this,FourByteChunk *param_1)

{
  FourByteChunk *param_1_local;
  FourByteChunk *this_local;
  
  *(undefined4 *)this->_otherParameters = *(undefined4 *)param_1->_otherParameters;
  return this;
}

Assistant:

class OPENDIS7_EXPORT FourByteChunk
{
protected:
  /** four bytes of arbitrary data */
  char _otherParameters[4]; 


 public:
    FourByteChunk();
    virtual ~FourByteChunk();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    char*  getOtherParameters(); 
    const char*  getOtherParameters() const; 
    void setOtherParameters( const char*    pX);


virtual int getMarshalledSize() const;

     bool operator  ==(const FourByteChunk& rhs) const;
}